

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O3

void __thiscall SSD1306::OledI2C::sendCommand(OledI2C *this,uint8_t command)

{
  int __v;
  ssize_t sVar1;
  long *plVar2;
  system_error *this_00;
  int *piVar3;
  error_category *__ecat;
  size_type *psVar4;
  array<unsigned_char,_2UL> data;
  string what;
  undefined1 local_7a;
  uint8_t local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  local_7a = 0;
  local_79 = command;
  sVar1 = write((this->fd_).fd_,&local_7a,2);
  if (sVar1 != -1) {
    return;
  }
  std::__cxx11::to_string(&local_38,0x1dc);
  std::operator+(&local_58,
                 "write /workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/OledI2C.cxx("
                 ,&local_38);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_78._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_78._M_dataplus._M_p == psVar4) {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78.field_2._8_8_ = plVar2[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar4;
  }
  local_78._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  __v = *piVar3;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,__v,__ecat,&local_78);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void
SSD1306::OledI2C::sendCommand(
    uint8_t command) const
{
    std::array<uint8_t, 2> data{OLED_COMMAND, command};

    if (::write(fd_.fd(), data.data(), data.size()) == -1)
    {
        std::string what( "write " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }
}